

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::Unser<DataStream,std::vector<uint256,std::allocator<uint256>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<uint256,_std::allocator<uint256>_> *v)

{
  long lVar1;
  pointer puVar2;
  uint64_t uVar3;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data.
      _M_finish != puVar2) {
    (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  uVar3 = ReadCompactSize<DataStream>(s,true);
  __n = 0;
  while (__n < uVar3) {
    __n = __n + 0x2625a;
    if (uVar3 <= __n) {
      __n = uVar3;
    }
    std::vector<uint256,_std::allocator<uint256>_>::reserve(v,__n);
    while ((ulong)((long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 5) < __n) {
      std::vector<uint256,_std::allocator<uint256>_>::emplace_back<>(v);
      base_blob<256U>::Unserialize<DataStream>
                (&(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                  super__Vector_impl_data._M_finish[-1].super_base_blob<256U>,s);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }